

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meld.cpp
# Opt level: O1

bool __thiscall mahjong::Meld::isSimples(Meld *this)

{
  bool bVar1;
  IsSimple local_a;
  IsSimple local_9;
  
  bVar1 = IsSimple::operator()
                    (&local_9,(this->tiles).
                              super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  if (bVar1) {
    bVar1 = IsSimple::operator()
                      (&local_a,(this->tiles).
                                super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                                _M_impl.super__Vector_impl_data._M_finish + -1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Meld::isSimples() const
{
	return IsSimple()(tiles.front()) && IsSimple()(tiles.back());
}